

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

void __thiscall
t_c_glib_generator::generate_serialize_container
          (t_c_glib_generator *this,ostream *out,t_type *ttype,string *prefix,int error_ret)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  size_type sVar5;
  int iVar6;
  t_type *ptVar7;
  t_type *ptVar8;
  ostream *poVar9;
  ostream *poVar10;
  long *plVar11;
  size_t sVar12;
  ulong *puVar13;
  size_type *psVar14;
  t_c_glib_generator *this_00;
  char *pcVar15;
  string tkey_ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tval_ptr;
  string tval_name;
  string tkey_name;
  string keyname;
  string valname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_2d0;
  ostream *local_2b0;
  int local_2a4;
  string local_2a0;
  string *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  t_map *local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_2a4 = error_ret;
  local_280 = prefix;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  local_2b0 = out;
  if ((char)iVar6 == '\0') {
    iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar6 != '\0') {
      ptVar7 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      type_name_abi_cxx11_(&local_218,this,ptVar7,false,false);
      iVar6 = (*(ptVar7->super_t_doc)._vptr_t_doc[6])(ptVar7);
      if ((char)iVar6 == '\0') {
        iVar6 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
        pcVar15 = "";
        if ((char)iVar6 != '\0') {
          pcVar15 = "*";
        }
      }
      else {
        pcVar15 = "";
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      sVar12 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,pcVar15,pcVar15 + sVar12)
      ;
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"GList *key_list = NULL, *iter = NULL;",0x25);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_278._M_dataplus._M_p,local_278._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"* keys;",7);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"int i = 0, key_count;",0x15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," elem;",6);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"gpointer value;",0xf);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_238._M_dataplus._M_p,local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"THRIFT_UNUSED_VAR (value);",0x1a);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
      pcVar15 = "if ((ret = thrift_protocol_write_set_begin (protocol, ";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"if ((ret = thrift_protocol_write_set_begin (protocol, ",0x36);
      type_to_enum_abi_cxx11_(&local_190,(t_c_glib_generator *)pcVar15,ptVar7);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_190._M_dataplus._M_p,local_190._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ? ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"(gint32) g_hash_table_size ((GHashTable *) ",0x2b);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,") : 0",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", error)) < 0)",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      local_198 = (t_map *)ttype;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      paVar2 = &local_2d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2a4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"xfer += ret;",0xc);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_278._M_dataplus._M_p,local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"if (",4);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"  g_hash_table_foreach ((GHashTable *) ",0x27);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,", thrift_hash_table_get_keys, &key_list);",0x29);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"key_count = g_list_length (key_list);",0x25);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"keys = g_newa (",0xf);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", key_count);",0xd);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_238._M_dataplus._M_p,local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"for (iter = g_list_first (key_list); iter; iter = iter->next)",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      out = local_2b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      paVar3 = &local_278.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar3) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"keys[i++] = (",0xd);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,") iter->data;",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"g_list_free (key_list);",0x17);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_278._M_dataplus._M_p,local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"for (i = 0; i < key_count; ++i)",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar3) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"elem = keys[i];",0xf);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_278._M_dataplus._M_p,local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"value = (gpointer) g_hash_table_lookup (((GHashTable *) ",0x38);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"), (gpointer) elem);",0x14);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar3) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_258._M_dataplus._M_p,
                 local_258._M_dataplus._M_p + local_258._M_string_length);
      std::__cxx11::string::append((char *)&local_130);
      generate_serialize_set_element(this,out,(t_set *)local_198,&local_130,local_2a4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"if ((ret = thrift_protocol_write_set_end (protocol, error)) < 0)",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2a4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"xfer += ret;",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      goto LAB_0016dbe2;
    }
    iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar6 == '\0') goto LAB_0016dc02;
    std::operator+(&local_278,"(",local_280);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_278);
    paVar2 = &local_2d0.field_2;
    puVar13 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_2d0.field_2._M_allocated_capacity = *puVar13;
      local_2d0.field_2._8_8_ = plVar11[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *puVar13;
      local_2d0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_2d0._M_string_length = plVar11[1];
    *plVar11 = (long)puVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2d0,(ulong)(local_280->_M_dataplus)._M_p);
    psVar14 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar11[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_258._M_string_length = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    psVar14 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_218.field_2._M_allocated_capacity = *psVar14;
      local_218.field_2._8_8_ = plVar11[3];
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar14;
      local_218._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_218._M_string_length = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    paVar3 = &local_278.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar3) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"i","");
    t_generator::tmp(&local_258,(t_generator *)this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"guint ",6);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_278._M_dataplus._M_p,local_278._M_string_length);
    pcVar15 = "if ((ret = thrift_protocol_write_list_begin (protocol, ";
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"if ((ret = thrift_protocol_write_list_begin (protocol, ",0x37);
    type_to_enum_abi_cxx11_
              (&local_1f8,(t_c_glib_generator *)pcVar15,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", (gint32) ",0xb);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", error)) < 0)",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar3) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2a4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"xfer += ret;",0xc);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_278._M_dataplus._M_p,local_278._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for (",5);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = 0; ",6);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," < ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"++)",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar3) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    t_oop_generator::scope_up(&this->super_t_oop_generator,local_2b0);
    pcVar4 = (local_280->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + local_280->_M_string_length);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_258._M_dataplus._M_p,
               local_258._M_dataplus._M_p + local_258._M_string_length);
    generate_serialize_list_element(this,local_2b0,(t_list *)ttype,&local_b0,&local_d0,local_2a4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,local_2b0);
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"if ((ret = thrift_protocol_write_list_end (protocol, error)) < 0)",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2a4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"xfer += ret;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    out = local_2b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_0016dc02;
  }
  else {
    ptVar7 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
    ptVar8 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
    local_198 = (t_map *)ttype;
    type_name_abi_cxx11_(&local_218,this,ptVar7,false,false);
    type_name_abi_cxx11_(&local_258,this,ptVar8,false,false);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    local_2d0._M_string_length = 0;
    local_2d0.field_2._M_allocated_capacity =
         local_2d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"key","");
    t_generator::tmp(&local_1f8,(t_generator *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"val","");
    t_generator::tmp(&local_1d8,(t_generator *)this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    declore_local_variable_for_write(this,local_2b0,ptVar7,&local_1f8);
    declore_local_variable_for_write(this,local_2b0,ptVar8,&local_1d8);
    ptVar7 = t_type::get_true_type(ptVar7);
    ptVar8 = t_type::get_true_type(ptVar8);
    iVar6 = (*(ptVar7->super_t_doc)._vptr_t_doc[6])(ptVar7);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
      pcVar15 = "";
      if ((char)iVar6 != '\0') {
        pcVar15 = "*";
      }
    }
    else {
      pcVar15 = "";
    }
    sVar5 = local_2d0._M_string_length;
    strlen(pcVar15);
    std::__cxx11::string::_M_replace((ulong)&local_2d0,0,(char *)sVar5,(ulong)pcVar15);
    iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[6])(ptVar8);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[5])(ptVar8);
      pcVar15 = "";
      if ((char)iVar6 != '\0') {
        pcVar15 = "*";
      }
    }
    else {
      pcVar15 = "";
    }
    sVar5 = local_278._M_string_length;
    strlen(pcVar15);
    std::__cxx11::string::_M_replace((ulong)&local_278,0,(char *)sVar5,(ulong)pcVar15);
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"GList *key_list = NULL, *iter = NULL;",0x25);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_238._M_dataplus._M_p,local_238._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"* keys;",7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"int i = 0, key_count;",0x15);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_190._M_dataplus._M_p,local_190._M_string_length);
    pcVar15 = "if ((ret = thrift_protocol_write_map_begin (protocol, ";
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"if ((ret = thrift_protocol_write_map_begin (protocol, ",0x36);
    type_to_enum_abi_cxx11_(&local_150,(t_c_glib_generator *)pcVar15,ptVar7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_150._M_dataplus._M_p,local_150._M_string_length);
    this_00 = (t_c_glib_generator *)0x3a9b9f;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    type_to_enum_abi_cxx11_(&local_170,this_00,ptVar8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ? ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"(gint32) g_hash_table_size ((GHashTable *) ",0x2b);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") : 0",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", error)) < 0)",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    paVar2 = &local_2a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2a4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"xfer += ret;",0xc);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_238._M_dataplus._M_p,local_238._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"if (",4);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  g_hash_table_foreach ((GHashTable *) ",0x27);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,", thrift_hash_table_get_keys, &key_list);",0x29);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_190._M_dataplus._M_p,local_190._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"key_count = g_list_length (key_list);",0x25);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"keys = g_newa (",0xf);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", key_count);",0xd);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"for (iter = g_list_first (key_list); iter; iter = iter->next)",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    poVar9 = local_2b0;
    paVar3 = &local_238.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar3) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"keys[i++] = (",0xd);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_218._M_dataplus._M_p,local_218._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") iter->data;",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"g_list_free (key_list);",0x17);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_238._M_dataplus._M_p,local_238._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"for (i = 0; i < key_count; ++i)",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar3) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    t_oop_generator::scope_up(&this->super_t_oop_generator,poVar9);
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar9 = local_2b0;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_2b0,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = keys[i];",0xb);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_238._M_dataplus._M_p,local_238._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = (",4);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_258._M_dataplus._M_p,local_258._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_278._M_dataplus._M_p,local_278._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,") g_hash_table_lookup (((GHashTable *) ",0x27);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"), (gpointer) ",0xe);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar3) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    local_2a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_2d0._M_dataplus._M_p,
               (char *)(local_2d0._M_string_length + (long)local_2d0._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_2a0);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2a0,(ulong)local_1f8._M_dataplus._M_p);
    psVar14 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_110.field_2._M_allocated_capacity = *psVar14;
      local_110.field_2._8_4_ = (undefined4)plVar11[3];
      local_110.field_2._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar14;
      local_110._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_110._M_string_length = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_238._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,local_278._M_dataplus._M_p,
               (char *)(local_278._M_string_length + (long)local_278._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_238);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_238,(ulong)local_1d8._M_dataplus._M_p);
    psVar14 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_f0.field_2._M_allocated_capacity = *psVar14;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar14;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    generate_serialize_map_element(this,poVar9,local_198,&local_110,&local_f0,local_2a4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar3) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,poVar9);
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    out = local_2b0;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_2b0,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"if ((ret = thrift_protocol_write_map_end (protocol, error)) < 0)",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2a4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"xfer += ret;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
LAB_0016dbe2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_0016dc02;
  }
  operator_delete(local_218._M_dataplus._M_p);
LAB_0016dc02:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_container(ostream& out,
                                                      t_type* ttype,
                                                      string prefix,
                                                      int error_ret) {
  scope_up(out);

  if (ttype->is_map()) {
    t_type* tkey = ((t_map*)ttype)->get_key_type();
    t_type* tval = ((t_map*)ttype)->get_val_type();
    string tkey_name = type_name(tkey);
    string tval_name = type_name(tval);
    string tkey_ptr;
    string tval_ptr;
    string keyname = tmp("key");
    string valname = tmp("val");

    declore_local_variable_for_write(out, tkey, keyname);
    declore_local_variable_for_write(out, tval, valname);

    /* If either the key or value type is a typedef, find its underlying type so
       we can correctly determine how to generate a pointer to it */
    tkey = get_true_type(tkey);
    tval = get_true_type(tval);

    tkey_ptr = tkey->is_string() || !tkey->is_base_type() ? "" : "*";
    tval_ptr = tval->is_string() || !tval->is_base_type() ? "" : "*";

    /*
     * Some ugliness here.  To maximize backwards compatibility, we
     * avoid using GHashTableIter and instead get a GList of all keys,
     * then copy it into a array on the stack, and free it.
     * This is because we may exit early before we get a chance to free the
     * GList.
     */
    out << indent() << "GList *key_list = NULL, *iter = NULL;" << endl
        << indent() << tkey_name << tkey_ptr << "* keys;" << endl
        << indent() << "int i = 0, key_count;" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_map_begin (protocol, "
        << type_to_enum(tkey) << ", " << type_to_enum(tval) << ", " << prefix << " ? "
        << "(gint32) g_hash_table_size ((GHashTable *) " << prefix << ") : 0"
        << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "if (" << prefix << ")" << endl
        << indent() << "  g_hash_table_foreach ((GHashTable *) " << prefix
        << ", thrift_hash_table_get_keys, &key_list);" << endl
        << indent() << "key_count = g_list_length (key_list);" << endl
        << indent() << "keys = g_newa (" << tkey_name << tkey_ptr
        << ", key_count);" << endl
        << indent() << "for (iter = g_list_first (key_list); iter; "
           "iter = iter->next)" << endl;
    indent_up();
    out << indent() << "keys[i++] = (" << tkey_name << tkey_ptr
        << ") iter->data;" << endl;
    indent_down();
    out << indent() << "g_list_free (key_list);" << endl
        << endl
        << indent() << "for (i = 0; i < key_count; ++i)" << endl;
    scope_up(out);
    out << indent() << keyname << " = keys[i];" << endl
        << indent() << valname << " = (" << tval_name << tval_ptr
        << ") g_hash_table_lookup (((GHashTable *) " << prefix
        << "), (gpointer) " << keyname << ");" << endl
        << endl;
    generate_serialize_map_element(out,
                                   (t_map*)ttype,
                                   tkey_ptr + " " + keyname,
                                   tval_ptr + " " + valname,
                                   error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_map_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  } else if (ttype->is_set()) {
    t_type* telem = ((t_set*)ttype)->get_elem_type();
    string telem_name = type_name(telem);
    string telem_ptr = telem->is_string() || !telem->is_base_type() ? "" : "*";
    out << indent() << "GList *key_list = NULL, *iter = NULL;" << endl
        << indent() << telem_name << telem_ptr << "* keys;" << endl
        << indent() << "int i = 0, key_count;" << endl
        << indent() << telem_name << telem_ptr << " elem;" << endl
        << indent() << "gpointer value;" << endl
        << indent() << "THRIFT_UNUSED_VAR (value);" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_set_begin (protocol, "
        << type_to_enum(telem) << ", " << prefix << " ? "
        << "(gint32) g_hash_table_size ((GHashTable *) " << prefix << ") : 0"
        << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "if (" << prefix << ")" << endl
        << indent() << "  g_hash_table_foreach ((GHashTable *) " << prefix
        << ", thrift_hash_table_get_keys, &key_list);" << endl
        << indent() << "key_count = g_list_length (key_list);" << endl
        << indent() << "keys = g_newa (" << telem_name << telem_ptr
        << ", key_count);" << endl
        << indent() << "for (iter = g_list_first (key_list); iter; "
           "iter = iter->next)" << endl;
    indent_up();
    out << indent() << "keys[i++] = (" << telem_name << telem_ptr
        << ") iter->data;" << endl;
    indent_down();
    out << indent() << "g_list_free (key_list);" << endl
        << endl
        << indent() << "for (i = 0; i < key_count; ++i)" << endl;
    scope_up(out);
    out << indent() << "elem = keys[i];" << endl
        << indent() << "value = (gpointer) g_hash_table_lookup "
           "(((GHashTable *) " << prefix << "), (gpointer) elem);" << endl
        << endl;
    generate_serialize_set_element(out,
                                   (t_set*)ttype,
                                   telem_ptr + "elem",
                                   error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_set_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  } else if (ttype->is_list()) {
    string length = "(" + prefix + " ? " + prefix + "->len : 0)";
    string i = tmp("i");
    out << indent() << "guint " << i << ";" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_list_begin (protocol, "
        << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", (gint32) "
        << length << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "for (" << i << " = 0; " << i << " < " << length << "; "
        << i << "++)" << endl;
    scope_up(out);
    generate_serialize_list_element(out, (t_list*)ttype, prefix, i, error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_list_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  }

  scope_down(out);
}